

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int doremote(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  char *pcVar3;
  size_t lcode;
  
  L_00 = getstate(L);
  pcVar3 = luaL_checklstring(L,2,&lcode);
  lua_settop(L_00,0);
  iVar1 = luaL_loadbufferx(L_00,pcVar3,lcode,pcVar3,(char *)0x0);
  if ((iVar1 == 0) && (iVar1 = lua_pcallk(L_00,0,-1,0,0,(lua_KFunction)0x0), iVar1 == 0)) {
    iVar1 = 1;
    while (iVar2 = lua_type(L_00,iVar1), iVar2 != -1) {
      pcVar3 = lua_tolstring(L_00,iVar1,(size_t *)0x0);
      lua_pushstring(L,pcVar3);
      iVar1 = iVar1 + 1;
    }
    lua_settop(L_00,-iVar1);
    return iVar1 + -1;
  }
  lua_pushnil(L);
  pcVar3 = lua_tolstring(L_00,-1,(size_t *)0x0);
  lua_pushstring(L,pcVar3);
  lua_pushinteger(L,(long)iVar1);
  return 3;
}

Assistant:

static int doremote (lua_State *L) {
  lua_State *L1 = getstate(L);
  size_t lcode;
  const char *code = luaL_checklstring(L, 2, &lcode);
  int status;
  lua_settop(L1, 0);
  status = luaL_loadbuffer(L1, code, lcode, code);
  if (status == LUA_OK)
    status = lua_pcall(L1, 0, LUA_MULTRET, 0);
  if (status != LUA_OK) {
    lua_pushnil(L);
    lua_pushstring(L, lua_tostring(L1, -1));
    lua_pushinteger(L, status);
    return 3;
  }
  else {
    int i = 0;
    while (!lua_isnone(L1, ++i))
      lua_pushstring(L, lua_tostring(L1, i));
    lua_pop(L1, i-1);
    return i-1;
  }
}